

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

char * addpackagedir(char *dir)

{
  bool bVar1;
  size_t sVar2;
  char **s;
  packagedir *ppVar3;
  size_t sVar4;
  int local_158;
  char *local_150;
  int local_148;
  char *local_140;
  packagedir *pf;
  char *filter;
  string pdir;
  char *dir_local;
  
  copystring((char *)&filter,dir,0x104);
  bVar1 = subhomedir((char *)&filter,0x104,dir);
  if ((bVar1) && (sVar2 = fixpackagedir((char *)&filter), sVar2 != 0)) {
    pf = (packagedir *)&filter;
    while ((s = (char **)strstr((char *)pf,"packages"), s != (char **)0x0 &&
           (((s <= &filter || (*(char *)((long)s + -1) != '/')) ||
            (*(char *)((long)s + (long)addpackagedir::len) != '/'))))) {
      pf = (packagedir *)((long)s + (long)addpackagedir::len);
    }
    ppVar3 = vector<packagedir>::add(&packagedirs);
    if (s == (char **)0x0) {
      local_140 = newstring((char *)&filter);
    }
    else {
      local_140 = newstring((char *)&filter,(long)s - (long)&filter);
    }
    ppVar3->dir = local_140;
    if (s == (char **)0x0) {
      sVar4 = strlen((char *)&filter);
      local_148 = (int)sVar4;
    }
    else {
      local_148 = (int)s - (int)&filter;
    }
    ppVar3->dirlen = local_148;
    if (s == (char **)0x0) {
      local_150 = (char *)0x0;
    }
    else {
      local_150 = newstring((char *)s);
    }
    ppVar3->filter = local_150;
    if (s == (char **)0x0) {
      local_158 = 0;
    }
    else {
      sVar4 = strlen((char *)s);
      local_158 = (int)sVar4;
    }
    ppVar3->filterlen = local_158;
    dir_local = ppVar3->dir;
  }
  else {
    dir_local = (char *)0x0;
  }
  return dir_local;
}

Assistant:

const char *addpackagedir(const char *dir)
{
    string pdir;
    copystring(pdir, dir);
    if(!subhomedir(pdir, sizeof(pdir), dir) || !fixpackagedir(pdir)) return NULL;
    char *filter = pdir;
    for(;;)
    {
        static int len = strlen("packages");
        filter = strstr(filter, "packages");
        if(!filter) break;
        if(filter > pdir && filter[-1] == PATHDIV && filter[len] == PATHDIV) break;
        filter += len;
    }
    packagedir &pf = packagedirs.add();
    pf.dir = filter ? newstring(pdir, filter-pdir) : newstring(pdir);
    pf.dirlen = filter ? filter-pdir : strlen(pdir);
    pf.filter = filter ? newstring(filter) : NULL;
    pf.filterlen = filter ? strlen(filter) : 0;
    return pf.dir;
}